

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.h
# Opt level: O1

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::AddPendingDisposeObject
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  undefined8 *in_FS_OFFSET;
  
  uVar4 = (short)*(undefined4 *)&this->pendingDisposeCount + 1;
  this->pendingDisposeCount = uVar4;
  if ((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectCount < uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.h"
                       ,0x45,"(this->pendingDisposeCount <= this->objectCount)",
                       "this->pendingDisposeCount <= this->objectCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void AddPendingDisposeObject()
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            AssertMsg(!this->isPendingConcurrentSweepPrep, "Finalizable blocks don't support allocations during concurrent sweep.");
        }
#endif

        this->pendingDisposeCount++;
        Assert(this->pendingDisposeCount <= this->objectCount);
    }